

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O1

Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *
Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::zero(void)

{
  int iVar1;
  void **head;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_RDI;
  __mpz_struct _Stack_48;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_38;
  uint local_18 [2];
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *local_10;
  
  if ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>::zero()::p == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>::zero()::p)
     , iVar1 != 0)) {
    IntegerConstantType::IntegerConstantType((IntegerConstantType *)&_Stack_48,0);
    local_38._factors._capacity = 0;
    local_38._factors._cursor = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
    local_38._factors._end = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
    local_38._factors._stack = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
    ::Lib::
    perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
              ((Lib *)local_18,&local_38);
    IntegerConstantType::IntegerConstantType(&zero::p.numeral,(IntegerConstantType *)&_Stack_48);
    zero::p.factors._id = local_18[0];
    zero::p.factors._ptr = local_10;
    MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~MonomFactors(&local_38);
    mpz_clear(&_Stack_48);
    __cxa_atexit(~Monom,&zero::p,&__dso_handle);
    __cxa_guard_release(&Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>::zero()::p);
  }
  IntegerConstantType::IntegerConstantType(&in_RDI->numeral,&zero::p.numeral);
  (in_RDI->factors)._id = zero::p.factors._id;
  (in_RDI->factors)._ptr = zero::p.factors._ptr;
  return in_RDI;
}

Assistant:

Monom<Number> Monom<Number>::zero() 
{ 
  static Monom p = Monom(Numeral(0), perfect(MonomFactors<Number>()));
  ASS(p.isZeroConst()) 
  return p; 
}